

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::api::json::DecodeLockingScript::DecodeLockingScript
          (DecodeLockingScript *this,DecodeLockingScript *param_1)

{
  (this->super_JsonClassBase<cfd::api::json::DecodeLockingScript>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeLockingScript_002cfc50;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  std::__cxx11::string::string((string *)&this->asm__,(string *)&param_1->asm__);
  std::__cxx11::string::string((string *)&this->hex_,(string *)&param_1->hex_);
  this->req_sigs_ = param_1->req_sigs_;
  std::__cxx11::string::string((string *)&this->type_,(string *)&param_1->type_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->addresses_,&param_1->addresses_);
  return;
}

Assistant:

DecodeLockingScript() {
    CollectFieldName();
  }